

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong_conflict
helper_extr_r_w_mips
          (target_ulong_conflict ac,target_ulong_conflict shift,CPUMIPSState_conflict *env)

{
  byte *pbVar1;
  byte bVar2;
  ulong local_28;
  long local_20;
  
  mipsdsp_rndrashift_short_acc((int64_t *)&local_28,ac,shift & 0x1f,env);
  if (local_28 >> 0x20 == 0 && local_20 == 0) {
    bVar2 = 0;
  }
  else {
    if (local_20 != 1 || local_28 < 0xffffffff00000000) {
      pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
      *pbVar1 = *pbVar1 | 0x80;
    }
    bVar2 = ((byte)local_20 ^ local_28 == 0xffffffffffffffff) & 1;
  }
  local_28 = local_28 + 1;
  if ((local_28 >> 0x20 != 0 || bVar2 != 0) && ((bVar2 & 0xfffffffeffffffff < local_28) == 0)) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return (target_ulong_conflict)(local_28 >> 1);
}

Assistant:

target_ulong helper_extr_r_w(target_ulong ac, target_ulong shift,
                             CPUMIPSState *env)
{
    int64_t tempDL[2];

    shift = shift & 0x1F;

    mipsdsp_rndrashift_short_acc(tempDL, ac, shift, env);
    if ((tempDL[1] != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        (tempDL[1] != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    tempDL[0] += 1;
    if (tempDL[0] == 0) {
        tempDL[1] += 1;
    }

    if (((tempDL[1] & 0x01) != 0 || (tempDL[0] & MIPSDSP_LHI) != 0) &&
        ((tempDL[1] & 0x01) != 1 || (tempDL[0] & MIPSDSP_LHI) != MIPSDSP_LHI)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (target_long)(int32_t)(tempDL[0] >> 1);
}